

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O0

string * adios2::ToString_abi_cxx11_(Box<Dims> *box)

{
  string *in_RDI;
  string *s;
  string local_68 [32];
  string local_48 [32];
  Dims *in_stack_ffffffffffffffd8;
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"{",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  ToString_abi_cxx11_(in_stack_ffffffffffffffd8);
  std::__cxx11::string::operator+=((string *)in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::operator+=((string *)in_RDI,",");
  ToString_abi_cxx11_(in_stack_ffffffffffffffd8);
  std::__cxx11::string::operator+=((string *)in_RDI,local_68);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::operator+=((string *)in_RDI,"}");
  return in_RDI;
}

Assistant:

std::string ToString(const Box<Dims> &box)
{
    std::string s = "{";
    s += ToString(box.first);
    s += ",";
    s += ToString(box.second);
    s += "}";
    return s;
}